

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int _elempack;
  uint uVar2;
  uint uVar3;
  uint _c;
  Mat *src;
  ulong _elemsize;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pMVar9;
  pointer pMVar10;
  pointer pMVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  undefined4 *puVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 *puVar20;
  int iVar21;
  undefined4 *puVar22;
  int iVar23;
  undefined4 *puVar24;
  int iVar25;
  long lVar26;
  undefined4 *puVar27;
  long lVar28;
  int iVar29;
  void *pvVar30;
  long lVar31;
  int *piVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  Mat local_80;
  uint local_34;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  uVar1 = src->dims;
  _elemsize = src->elemsize;
  _elempack = src->elempack;
  uVar7 = (ulong)_elempack;
  lVar28 = *(long *)(&this->field_0xd0 + (long)this->_vptr_Slice_x86[-3]);
  uVar12 = (*(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]) >> 0x1f & uVar1) +
           *(int *)(&this->field_0x118 + (long)this->_vptr_Slice_x86[-3]);
  if (uVar1 == 1) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      bVar35 = false;
      goto LAB_00335ca1;
    }
    iVar17 = src->w;
    uVar14 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
    lVar26 = 0;
    lVar13 = 0;
    iVar29 = 0;
    uVar18 = 0;
    do {
      uVar2 = *(uint *)(lVar28 + uVar18 * 4);
      uVar8 = (ulong)uVar2;
      if (uVar2 == 0xffffff17) {
        uVar8 = (ulong)(long)(iVar17 * _elempack - iVar29) / (uVar14 + lVar13);
      }
      bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
      iVar23 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
      Mat::create((Mat *)((long)&pMVar9->data + lVar26),
                  (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                       (long)iVar23),_elemsize / uVar7 << bVar6 * '\x02',iVar23,opt->blob_allocator)
      ;
      pvVar30 = *(void **)((long)&pMVar9->data + lVar26);
      if (pvVar30 == (void *)0x0) {
        return -100;
      }
      if ((long)*(int *)((long)&pMVar9->c + lVar26) * *(long *)((long)&pMVar9->cstep + lVar26) == 0)
      {
        return -100;
      }
      memcpy(pvVar30,(void *)((long)iVar29 * 4 + (long)src->data),
             (long)*(int *)((long)&pMVar9->w + lVar26) * *(long *)((long)&pMVar9->elemsize + lVar26)
            );
      iVar29 = iVar29 + (int)uVar8;
      uVar18 = uVar18 + 1;
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + -1;
      lVar26 = lVar26 + 0x48;
    } while (uVar18 < uVar14);
  }
  bVar35 = uVar1 == 2;
  if ((bVar35) && (uVar12 == 0)) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
    iVar17 = src->w;
    if (pMVar11 != pMVar9) {
      iVar29 = src->h;
      lVar26 = 0;
      lVar13 = 0;
      iVar23 = 0;
      uVar18 = 0;
      do {
        uVar2 = *(uint *)(lVar28 + uVar18 * 4);
        uVar8 = (ulong)uVar2;
        if (uVar2 == 0xffffff17) {
          uVar8 = (ulong)(long)(iVar29 * _elempack - iVar23) / (uVar14 + lVar13);
        }
        bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
        iVar21 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar9->data + lVar26),iVar17,
                    (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                         (long)iVar21),_elemsize / uVar7 << bVar6 * '\x02',iVar21,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar26) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar26) * *(long *)((long)&pMVar9->cstep + lVar26) ==
            0) {
          return -100;
        }
        iVar23 = iVar23 + (int)uVar8;
        uVar18 = uVar18 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar26 = lVar26 + 0x48;
      } while (uVar18 < uVar14);
    }
    iVar29 = pMVar9->elempack;
    if (pMVar11 != pMVar9) {
      lVar13 = uVar14 + (uVar14 == 0);
      piVar32 = &pMVar9->elempack;
      do {
        if (*piVar32 < iVar29) {
          iVar29 = *piVar32;
        }
        piVar32 = piVar32 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar29 < _elempack) {
      convert_packing(src,&local_80,iVar29,opt);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (pMVar11 != pMVar9) {
      lVar13 = (long)iVar17;
      uVar14 = 0;
      puVar15 = (undefined4 *)local_80.data;
      do {
        pMVar10 = pMVar9 + uVar14;
        iVar23 = pMVar10->elempack;
        if (((iVar29 == 1) && (iVar23 == 4)) && (iVar21 = pMVar10->h, 0 < (long)iVar21)) {
          pvVar30 = pMVar10->data;
          iVar16 = pMVar10->w;
          sVar4 = pMVar10->elemsize;
          lVar26 = 0;
          do {
            if (0 < iVar17) {
              puVar24 = (undefined4 *)((long)iVar16 * sVar4 * lVar26 + (long)pvVar30);
              puVar20 = puVar15;
              iVar25 = iVar17;
              do {
                *puVar24 = *puVar20;
                puVar24[1] = puVar20[lVar13];
                puVar24[2] = puVar20[iVar17 * 2];
                puVar27 = puVar20 + iVar17 * 3;
                puVar20 = puVar20 + 1;
                puVar24[3] = *puVar27;
                puVar24 = puVar24 + 4;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            puVar15 = puVar15 + lVar13 * 4;
            lVar26 = lVar26 + 1;
          } while (lVar26 != iVar21);
        }
        if (iVar29 == iVar23) {
          lVar26 = pMVar10->h * lVar13;
          memcpy(pMVar10->data,puVar15,pMVar10->elemsize * lVar26);
          puVar15 = puVar15 + (long)(int)lVar26 * (long)pMVar10->elempack;
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)(((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_00335ca1:
  if ((bVar35) && (uVar12 == 1)) {
    uVar2 = src->h;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar9 - (long)pMVar11 != 0) {
      iVar17 = src->w;
      uVar14 = ((long)pMVar9 - (long)pMVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar26 = 0;
      iVar29 = 0;
      uVar18 = 0;
      do {
        iVar23 = *(int *)(lVar28 + uVar18 * 4);
        if (iVar23 == -0xe9) {
          iVar23 = (int)((ulong)((long)iVar17 - (long)iVar29) / (uVar14 + lVar26));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),iVar23,uVar2,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar13) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar13) * *(long *)((long)&pMVar11->cstep + lVar13)
            == 0) {
          return -100;
        }
        iVar29 = iVar29 + iVar23;
        uVar18 = uVar18 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar9 - (long)pMVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar26 = lVar26 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar18 < uVar14);
    }
    if (0 < (int)uVar2) {
      uVar14 = 0;
      do {
        pMVar10 = pMVar11;
        if (pMVar9 != pMVar11) {
          pvVar30 = (void *)((long)src->w * uVar14 * src->elemsize + (long)src->data);
          lVar13 = 0x2c;
          uVar18 = 0;
          do {
            lVar26 = (long)*(int *)((long)&pMVar10->data + lVar13);
            memcpy((void *)(uVar14 * lVar26 * *(long *)((long)pMVar10 + lVar13 + -0x1c) +
                           *(long *)((long)pMVar10 + lVar13 + -0x2c)),pvVar30,lVar26 * _elemsize);
            pvVar30 = (void *)((long)pvVar30 +
                              (long)*(int *)((long)&pMVar10->data + lVar13) * uVar7 * 4);
            uVar18 = uVar18 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            lVar13 = lVar13 + 0x48;
          } while (uVar18 < (ulong)(((long)pMVar11 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar14 = uVar14 + 1;
        pMVar9 = pMVar11;
        pMVar11 = pMVar10;
      } while (uVar14 != uVar2);
    }
  }
  if (uVar1 - 3 < 2 && uVar12 == 0) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
    if (pMVar11 != pMVar9) {
      iVar17 = src->c;
      iVar29 = src->w;
      iVar23 = src->h;
      iVar21 = src->d;
      lVar26 = 0;
      lVar13 = 0;
      iVar16 = 0;
      uVar18 = 0;
      do {
        uVar2 = *(uint *)(lVar28 + uVar18 * 4);
        uVar8 = (ulong)uVar2;
        if (uVar2 == 0xffffff17) {
          uVar8 = (ulong)(long)(iVar17 * _elempack - iVar16) / (uVar14 + lVar13);
        }
        bVar6 = (uVar8 & 3) == 0 & opt->use_packing_layout;
        iVar25 = (uint)bVar6 + (uint)bVar6 * 2 + 1;
        Mat::create((Mat *)((long)&pMVar9->data + lVar26),iVar29,iVar23,iVar21,
                    (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                         (long)iVar25),_elemsize / uVar7 << bVar6 * '\x02',iVar25,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar26) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar26) * *(long *)((long)&pMVar9->cstep + lVar26) ==
            0) {
          return -100;
        }
        *(uint *)((long)&pMVar9->dims + lVar26) = uVar1;
        iVar16 = iVar16 + (int)uVar8;
        uVar18 = uVar18 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar26 = lVar26 + 0x48;
      } while (uVar18 < uVar14);
    }
    iVar17 = pMVar9->elempack;
    if (pMVar11 != pMVar9) {
      lVar13 = uVar14 + (uVar14 == 0);
      piVar32 = &pMVar9->elempack;
      do {
        if (*piVar32 < iVar17) {
          iVar17 = *piVar32;
        }
        piVar32 = piVar32 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    local_80.data = src->data;
    local_80.refcount = src->refcount;
    local_80.elemsize = src->elemsize;
    local_80.elempack = src->elempack;
    local_80.allocator = src->allocator;
    local_80.dims = src->dims;
    local_80.w = src->w;
    local_80.h = src->h;
    local_80.d = src->d;
    local_80.c = src->c;
    local_80.cstep = src->cstep;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (iVar17 < _elempack) {
      convert_packing(src,&local_80,iVar17,opt);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (pMVar11 != pMVar9) {
      uVar18 = 0;
      uVar14 = 0;
      do {
        pMVar10 = pMVar9 + uVar18;
        iVar29 = pMVar10->elempack;
        if ((iVar17 == 1) && (iVar29 == 4)) {
          iVar29 = pMVar10->c;
          if ((long)iVar29 < 1) {
            iVar29 = 4;
          }
          else {
            iVar23 = pMVar10->h * pMVar10->w * pMVar10->d;
            pvVar30 = pMVar10->data;
            sVar4 = pMVar10->cstep;
            sVar5 = pMVar10->elemsize;
            uVar14 = (ulong)(int)uVar14;
            lVar26 = local_80.cstep * local_80.elemsize;
            puVar24 = (undefined4 *)((uVar14 + 3) * lVar26 + (long)local_80.data);
            puVar27 = (undefined4 *)((uVar14 + 2) * lVar26 + (long)local_80.data);
            puVar15 = (undefined4 *)((uVar14 + 1) * lVar26 + (long)local_80.data);
            puVar20 = (undefined4 *)(lVar26 * uVar14 + (long)local_80.data);
            lVar13 = 0;
            do {
              if (0 < iVar23) {
                puVar22 = (undefined4 *)(sVar4 * sVar5 * lVar13 + (long)pvVar30);
                lVar31 = 0;
                do {
                  *puVar22 = puVar20[lVar31];
                  puVar22[1] = puVar15[lVar31];
                  puVar22[2] = puVar27[lVar31];
                  puVar22[3] = puVar24[lVar31];
                  puVar22 = puVar22 + 4;
                  lVar31 = lVar31 + 1;
                } while (iVar23 != (int)lVar31);
              }
              uVar14 = uVar14 + 4;
              lVar13 = lVar13 + 1;
              puVar24 = puVar24 + lVar26;
              puVar27 = puVar27 + lVar26;
              puVar15 = puVar15 + lVar26;
              puVar20 = puVar20 + lVar26;
            } while (lVar13 != iVar29);
            iVar29 = pMVar10->elempack;
          }
        }
        if (iVar17 == iVar29) {
          memcpy(pMVar10->data,
                 (undefined4 *)
                 (local_80.cstep * (long)(int)uVar14 * local_80.elemsize + (long)local_80.data),
                 (long)((int)pMVar10->cstep * pMVar10->c) * pMVar10->elemsize);
          uVar14 = (ulong)(uint)((int)uVar14 + pMVar10->c);
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)(((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_34 = uVar12 ^ 2;
  if ((uVar12 == 1 && (uVar1 ^ 3) == 0) || ((uVar1 ^ 4) == 0 && local_34 == 0)) {
    uVar2 = src->d;
    uVar3 = src->c;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar11 - (long)pMVar9 != 0) {
      iVar17 = src->w;
      iVar29 = src->h;
      uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar26 = 0;
      uVar18 = 0;
      iVar23 = 0;
      do {
        iVar21 = *(int *)(lVar28 + uVar18 * 4);
        if (iVar21 == -0xe9) {
          iVar21 = (int)((ulong)((long)iVar29 - (long)iVar23) / (uVar14 + lVar26));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar13),iVar17,iVar21,uVar2,uVar3,_elemsize,
                    _elempack,opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar13) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar13) * *(long *)((long)&pMVar9->cstep + lVar13) ==
            0) {
          return -100;
        }
        *(uint *)((long)&pMVar9->dims + lVar13) = uVar1;
        iVar23 = iVar23 + iVar21;
        uVar18 = uVar18 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar26 = lVar26 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar18 < uVar14);
    }
    if (0 < (int)uVar3) {
      uVar14 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar30 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          uVar18 = 0;
          pMVar10 = pMVar11;
          do {
            pMVar11 = pMVar9;
            pMVar9 = pMVar11;
            if (pMVar10 != pMVar11) {
              lVar13 = 0x40;
              uVar8 = 0;
              do {
                lVar31 = (long)*(int *)((long)pMVar9 + lVar13 + -0x14);
                lVar33 = (long)*(int *)((long)pMVar9 + lVar13 + -0x10);
                lVar26 = *(long *)((long)pMVar9 + lVar13 + -0x30);
                lVar34 = lVar33 * lVar31;
                memcpy((void *)(lVar26 * lVar33 * uVar18 * lVar31 +
                               *(long *)((long)&pMVar9->data + lVar13) * uVar14 * lVar26 +
                               *(long *)((long)pMVar9 + lVar13 + -0x40)),pvVar30,lVar34 * _elemsize)
                ;
                pvVar30 = (void *)((long)pvVar30 + (long)((int)lVar34 * _elempack) * 4);
                uVar8 = uVar8 + 1;
                pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
                lVar13 = lVar13 + 0x48;
              } while (uVar8 < (ulong)(((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar18 = uVar18 + 1;
            pMVar10 = pMVar11;
          } while (uVar18 != uVar2);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar3);
    }
  }
  if (((uVar1 ^ 3) == 0 && local_34 == 0) || ((uVar1 ^ 4) == 0 && uVar12 == 3)) {
    uVar2 = src->h;
    uVar3 = src->d;
    _c = src->c;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)pMVar11 - (long)pMVar9 != 0) {
      iVar17 = src->w;
      uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar26 = 0;
      lVar13 = 0;
      uVar18 = 0;
      iVar29 = 0;
      do {
        iVar23 = *(int *)(lVar28 + uVar18 * 4);
        if (iVar23 == -0xe9) {
          iVar23 = (int)((ulong)((long)iVar17 - (long)iVar29) / (uVar14 + lVar13));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar26),iVar23,uVar2,uVar3,_c,_elemsize,_elempack,
                    opt->blob_allocator);
        if (*(long *)((long)&pMVar9->data + lVar26) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar9->c + lVar26) * *(long *)((long)&pMVar9->cstep + lVar26) ==
            0) {
          return -100;
        }
        *(uint *)((long)&pMVar9->dims + lVar26) = uVar1;
        iVar29 = iVar29 + iVar23;
        uVar18 = uVar18 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar11 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar13 = lVar13 + -1;
        lVar26 = lVar26 + 0x48;
      } while (uVar18 < uVar14);
    }
    if (0 < (int)_c) {
      uVar14 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar30 = (void *)(src->cstep * uVar14 * src->elemsize + (long)src->data);
          uVar18 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar8 = 0;
              pMVar10 = pMVar11;
              do {
                pMVar11 = pMVar9;
                pMVar9 = pMVar11;
                if (pMVar10 != pMVar11) {
                  lVar13 = 0x40;
                  uVar19 = 0;
                  do {
                    lVar31 = (long)*(int *)((long)pMVar9 + lVar13 + -0x14);
                    lVar26 = *(long *)((long)pMVar9 + lVar13 + -0x30);
                    lVar33 = lVar26 * lVar31;
                    memcpy((void *)(lVar33 * uVar8 +
                                    (long)*(int *)((long)pMVar9 + lVar13 + -0x10) * uVar18 * lVar33
                                   + *(long *)((long)&pMVar9->data + lVar13) * uVar14 * lVar26 +
                                     *(long *)((long)pMVar9 + lVar13 + -0x40)),pvVar30,
                           lVar31 * _elemsize);
                    pvVar30 = (void *)((long)pvVar30 +
                                      (long)*(int *)((long)pMVar9 + lVar13 + -0x14) * uVar7 * 4);
                    uVar19 = uVar19 + 1;
                    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                              ._M_impl.super__Vector_impl_data._M_finish;
                    lVar13 = lVar13 + 0x48;
                  } while (uVar19 < (ulong)(((long)pMVar11 - (long)pMVar9 >> 3) *
                                           -0x71c71c71c71c71c7));
                }
                uVar8 = uVar8 + 1;
                pMVar10 = pMVar11;
              } while (uVar8 != uVar2);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar3);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != _c);
    }
  }
  if ((uVar1 == 4) && (uVar12 == 1)) {
    uVar1 = src->c;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pMVar9 - (long)pMVar11 != 0) {
      iVar17 = src->w;
      iVar29 = src->h;
      iVar23 = src->d;
      uVar14 = ((long)pMVar9 - (long)pMVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar26 = 0;
      uVar7 = 0;
      iVar21 = 0;
      do {
        iVar16 = *(int *)(lVar28 + uVar7 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar23 - (long)iVar21) / (uVar14 + lVar26));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar13),iVar17,iVar29,iVar16,uVar1,_elemsize,
                    _elempack,opt->blob_allocator);
        if (*(long *)((long)&pMVar11->data + lVar13) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar11->c + lVar13) * *(long *)((long)&pMVar11->cstep + lVar13)
            == 0) {
          return -100;
        }
        iVar21 = iVar21 + iVar16;
        uVar7 = uVar7 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar14 = ((long)pMVar9 - (long)pMVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar26 = lVar26 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar7 < uVar14);
    }
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        pMVar10 = pMVar11;
        if (pMVar9 != pMVar11) {
          pvVar30 = (void *)(src->cstep * uVar7 * src->elemsize + (long)src->data);
          lVar28 = 0x40;
          uVar14 = 0;
          do {
            lVar13 = (long)*(int *)((long)pMVar10 + lVar28 + -0xc) *
                     (long)*(int *)((long)pMVar10 + lVar28 + -0x10) *
                     (long)*(int *)((long)pMVar10 + lVar28 + -0x14);
            memcpy((void *)(*(long *)((long)&pMVar10->data + lVar28) * uVar7 *
                            *(long *)((long)pMVar10 + lVar28 + -0x30) +
                           *(long *)((long)pMVar10 + lVar28 + -0x40)),pvVar30,lVar13 * _elemsize);
            pvVar30 = (void *)((long)pvVar30 + (long)((int)lVar13 * _elempack) * 4);
            uVar14 = uVar14 + 1;
            pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            lVar28 = lVar28 + 0x48;
          } while (uVar14 < (ulong)(((long)pMVar11 - (long)pMVar10 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar7 = uVar7 + 1;
        pMVar9 = pMVar11;
        pMVar11 = pMVar10;
      } while (uVar7 != uVar1);
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h * top_blob.d;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    int size = top_blob.w * top_blob.h;

                    float* outptr = top_blob.channel(p).depth(j);
                    memcpy(outptr, ptr, size * elemsize);

                    ptr += size * elempack;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < d; j++)
            {
                for (int k = 0; k < h; k++)
                {
                    for (size_t i = 0; i < top_blobs.size(); i++)
                    {
                        Mat& top_blob = top_blobs[i];

                        float* outptr = top_blob.channel(p).depth(j).row(k);
                        memcpy(outptr, ptr, top_blob.w * elemsize);

                        ptr += top_blob.w * elempack;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (d - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h * top_blob.d;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    return 0;
}